

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeExtract.cpp
# Opt level: O3

void __thiscall
cali::AttributeExtract::AttributeExtract(AttributeExtract *this,SnapshotProcessFn *snap_fn)

{
  AttributeExtractImpl *__p;
  _Any_data local_40;
  code *local_30;
  
  __p = (AttributeExtractImpl *)operator_new(0x28);
  std::
  function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
  ::function((function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
              *)&local_40,snap_fn);
  std::
  function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
  ::function((function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
              *)__p,(function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
                     *)&local_40);
  (__p->m_id_attr).m_node = (Node *)0x0;
  (this->mP).
  super___shared_ptr<cali::AttributeExtract::AttributeExtractImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cali::AttributeExtract::AttributeExtractImpl*>
            (&(this->mP).
              super___shared_ptr<cali::AttributeExtract::AttributeExtractImpl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

AttributeExtract::AttributeExtract(SnapshotProcessFn snap_fn) : mP { new AttributeExtractImpl(snap_fn) }
{}